

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O1

void __thiscall
(anonymous_namespace)::IntrusiveListIteratorTest::
TestBackward<std::reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>>
          (IntrusiveListIteratorTest *this,
          reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>
          *first,reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>
                 *last,vector<int,_std::allocator<int>_> *expected)

{
  TestObject *pTVar1;
  intrusive_list<(anonymous_namespace)::TestObject> *piVar2;
  pointer pTVar3;
  int line;
  char *message;
  long lVar4;
  AssertionResult gtest_ar;
  internal local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  unsigned_long local_40;
  AssertHelper local_38;
  
  local_40 = 0;
  if (*(intrusive_list<(anonymous_namespace)::TestObject> **)this == (first->current).list_) {
    do {
      pTVar1 = (first->current).node_;
      if (*(TestObject **)(this + 8) == pTVar1) {
        local_48._M_head_impl =
             (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)(last->current).node_ - (long)(last->current).list_ >> 2);
        testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
                  (local_58,"count","expected.size()",&local_40,(unsigned_long *)&local_48);
        if (local_58[0] != (internal)0x0) goto LAB_00150662;
        testing::Message::Message((Message *)&local_48);
        if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = "";
        }
        else {
          message = (local_50->_M_dataplus)._M_p;
        }
        line = 0xb0;
LAB_00150637:
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/test-intrusive-list.cc"
                   ,line,message);
        testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_48);
        testing::internal::AssertHelper::~AssertHelper(&local_38);
        if (local_48._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_48._M_head_impl + 8))();
        }
LAB_00150662:
        if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_50,local_50);
        }
        return;
      }
      if (pTVar1 == (TestObject *)0x0) {
        __assert_fail("node_",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/intrusive-list.h"
                      ,0xe5,
                      "const_iterator &wabt::intrusive_list<(anonymous namespace)::TestObject>::const_iterator::operator++() [T = (anonymous namespace)::TestObject]"
                     );
      }
      (first->current).node_ =
           (pTVar1->super_intrusive_list_base<(anonymous_namespace)::TestObject>).next_;
      lVar4 = local_40 * 4;
      piVar2 = (last->current).list_;
      pTVar3 = std::
               reverse_iterator<wabt::intrusive_list<(anonymous_namespace)::TestObject>::const_iterator>
               ::operator->(first);
      testing::internal::CmpHelperEQ<int,int>
                (local_58,"expected[count]","last->data",(int *)((long)&piVar2->first_ + lVar4),
                 &pTVar3->data);
      if (local_58[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_48);
        if (local_50 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          message = "";
        }
        else {
          message = (local_50->_M_dataplus)._M_p;
        }
        line = 0xad;
        goto LAB_00150637;
      }
      if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_50,local_50);
      }
      local_40 = local_40 + 1;
    } while (*(intrusive_list<(anonymous_namespace)::TestObject> **)this == (first->current).list_);
  }
  __assert_fail("list_ == rhs.list_",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/intrusive-list.h"
                ,0xfc,
                "bool wabt::intrusive_list<(anonymous namespace)::TestObject>::const_iterator::operator==(const_iterator) const [T = (anonymous namespace)::TestObject]"
               );
}

Assistant:

void TestBackward(Iter first, Iter last, const std::vector<int>& expected) {
    size_t count = 0;
    while (first != last) {
      --last;
      ASSERT_EQ(expected[count], last->data);
      ++count;
    }
    ASSERT_EQ(count, expected.size());
  }